

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

int ptls_set_negotiated_protocol(ptls_t *tls,char *protocol,size_t protocol_len)

{
  char *__dest;
  
  if (protocol == (char *)0x0) {
    __dest = (char *)0x0;
  }
  else {
    if (protocol_len == 0) {
      protocol_len = strlen(protocol);
    }
    __dest = (char *)malloc(protocol_len + 1);
    if (__dest == (char *)0x0) {
      return 0x201;
    }
    memcpy(__dest,protocol,protocol_len);
    __dest[protocol_len] = '\0';
  }
  free(tls->negotiated_protocol);
  tls->negotiated_protocol = __dest;
  return 0;
}

Assistant:

int ptls_set_negotiated_protocol(ptls_t *tls, const char *protocol, size_t protocol_len)
{
    char *duped = NULL;

    if (protocol != NULL) {
        if (protocol_len == 0)
            protocol_len = strlen(protocol);
        if ((duped = malloc(protocol_len + 1)) == NULL)
            return PTLS_ERROR_NO_MEMORY;
        memcpy(duped, protocol, protocol_len);
        duped[protocol_len] = '\0';
    }

    free(tls->negotiated_protocol);
    tls->negotiated_protocol = duped;

    return 0;
}